

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project.c
# Opt level: O1

wchar_t project_path(chunk *c,loc *gp,wchar_t range,loc grid1,loc grid2,wchar_t flg)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  _Bool _Var4;
  int iVar5;
  loc grid2_00;
  loc lVar6;
  loc_conflict lVar7;
  square *psVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar16;
  uint uVar17;
  int iVar19;
  wchar_t y;
  int x;
  ulong uVar20;
  wchar_t x_00;
  short sVar21;
  int iVar22;
  int local_a0;
  int local_90;
  wchar_t local_78;
  wchar_t wVar15;
  wchar_t wVar18;
  
  grid2_00 = cave_find_decoy((chunk_conflict *)c);
  _Var4 = loc_eq((loc_conflict)grid1,(loc_conflict)grid2);
  uVar13 = 0;
  if (!_Var4) {
    wVar15 = grid2.y;
    y = grid1.y;
    uVar14 = wVar15 - y;
    iVar11 = (uint)(y <= wVar15) * 2 + -1;
    uVar3 = -uVar14;
    if (0 < (int)uVar14) {
      uVar3 = uVar14;
    }
    wVar18 = grid2.x;
    x_00 = grid1.x;
    uVar17 = wVar18 - x_00;
    iVar9 = (uint)(x_00 <= wVar18) * 2 + -1;
    uVar10 = -uVar17;
    if (0 < (int)uVar17) {
      uVar10 = uVar17;
    }
    iVar19 = uVar3 * uVar10;
    sVar21 = (short)flg;
    if (uVar10 < uVar3) {
      iVar22 = iVar11 + y;
      lVar6 = (loc)loc(x_00,iVar22);
      *gp = lVar6;
      uVar13 = 1;
      if (L'\x01' < range) {
        iVar5 = uVar17 * uVar17;
        iVar2 = iVar5 * 2;
        iVar16 = y + iVar11 * 2;
        iVar1 = 0;
        uVar20 = (ulong)grid1 & 0xffffffff;
        uVar12 = 1;
        do {
          x = (int)uVar20;
          uVar13 = uVar12;
          if ((flg & 4U) == 0) {
            lVar7 = loc(x,iVar22);
            _Var4 = loc_eq(lVar7,(loc_conflict)grid2);
            if (_Var4) break;
          }
          if (-1 < sVar21) {
            lVar6 = (loc)loc(x,iVar22);
            if (((uint)flg >> 0xc & 1) == 0) {
              _Var4 = square_isprojectable((chunk_conflict *)c,lVar6);
              if (!_Var4) break;
            }
            else {
              _Var4 = square_isbelievedwall((chunk_conflict *)c,lVar6);
              if (_Var4) break;
            }
          }
          if ((flg & 8U) != 0) {
            lVar6 = (loc)loc(x,iVar22);
            psVar8 = square((chunk_conflict *)c,lVar6);
            if (psVar8->mon != 0) break;
            lVar7 = loc(x,iVar22);
            _Var4 = loc_eq(lVar7,(loc_conflict)grid2_00);
            if (_Var4) break;
          }
          if ((wVar18 != x_00) && (iVar5 = iVar5 + iVar2, iVar19 <= iVar5)) {
            uVar20 = (ulong)(uint)(x + iVar9);
            iVar5 = iVar5 + iVar19 * -2;
            iVar1 = iVar1 + 1;
          }
          iVar22 = iVar22 + iVar11;
          uVar13 = uVar12 + 1;
          lVar6 = (loc)loc((int)uVar20,iVar16);
          gp[uVar12] = lVar6;
          iVar16 = iVar16 + iVar11;
          uVar12 = uVar13;
        } while ((iVar1 >> 1) + (int)uVar13 < range);
      }
    }
    else if (uVar3 < uVar10) {
      iVar22 = iVar9 + x_00;
      lVar6 = (loc)loc(iVar22,y);
      *gp = lVar6;
      uVar13 = 1;
      if (L'\x01' < range) {
        iVar5 = uVar14 * uVar14;
        iVar1 = iVar5 * 2;
        iVar16 = x_00 + iVar9 * 2;
        iVar2 = 0;
        uVar13 = 1;
        local_78 = y;
        do {
          if ((flg & 4U) == 0) {
            lVar7 = loc(iVar22,local_78);
            _Var4 = loc_eq(lVar7,(loc_conflict)grid2);
            if (_Var4) break;
          }
          if (-1 < sVar21) {
            lVar6 = (loc)loc(iVar22,local_78);
            if (((uint)flg >> 0xc & 1) == 0) {
              _Var4 = square_isprojectable((chunk_conflict *)c,lVar6);
              if (!_Var4) break;
            }
            else {
              _Var4 = square_isbelievedwall((chunk_conflict *)c,lVar6);
              if (_Var4) break;
            }
          }
          if ((flg & 8U) != 0) {
            lVar6 = (loc)loc(iVar22,local_78);
            psVar8 = square((chunk_conflict *)c,lVar6);
            if (psVar8->mon != 0) break;
            lVar7 = loc(iVar22,local_78);
            _Var4 = loc_eq(lVar7,(loc_conflict)grid2_00);
            if (_Var4) break;
          }
          if ((wVar15 != y) && (iVar5 = iVar5 + iVar1, iVar19 <= iVar5)) {
            local_78 = local_78 + iVar11;
            iVar5 = iVar5 + iVar19 * -2;
            iVar2 = iVar2 + 1;
          }
          iVar22 = iVar22 + iVar9;
          uVar12 = uVar13 + 1;
          lVar6 = (loc)loc(iVar16,local_78);
          gp[uVar13] = lVar6;
          iVar16 = iVar16 + iVar9;
          uVar13 = uVar12;
        } while ((iVar2 >> 1) + (int)uVar12 < range);
      }
    }
    else {
      local_a0 = iVar11 + y;
      iVar19 = iVar9 + x_00;
      lVar6 = (loc)loc(iVar19,local_a0);
      *gp = lVar6;
      uVar13 = 1;
      if (L'\x01' < range) {
        local_90 = y + iVar11 * 2;
        iVar22 = x_00 + iVar9 * 2;
        uVar13 = 1;
        do {
          if ((flg & 4U) == 0) {
            lVar7 = loc(iVar19,local_a0);
            _Var4 = loc_eq(lVar7,(loc_conflict)grid2);
            if (_Var4) break;
          }
          if (-1 < sVar21) {
            lVar6 = (loc)loc(iVar19,local_a0);
            if (((uint)flg >> 0xc & 1) == 0) {
              _Var4 = square_isprojectable((chunk_conflict *)c,lVar6);
              if (!_Var4) break;
            }
            else {
              _Var4 = square_isbelievedwall((chunk_conflict *)c,lVar6);
              if (_Var4) break;
            }
          }
          if ((flg & 8U) != 0) {
            lVar6 = (loc)loc(iVar19,local_a0);
            psVar8 = square((chunk_conflict *)c,lVar6);
            if (psVar8->mon != 0) break;
            lVar7 = loc(iVar19,local_a0);
            _Var4 = loc_eq(lVar7,(loc_conflict)grid2_00);
            if (_Var4) break;
          }
          local_a0 = local_a0 + iVar11;
          iVar19 = iVar19 + iVar9;
          uVar12 = uVar13 + 1;
          lVar6 = (loc)loc(iVar22,local_90);
          gp[uVar13] = lVar6;
          local_90 = local_90 + iVar11;
          iVar22 = iVar22 + iVar9;
          uVar13 = uVar12;
        } while ((int)(((uint)(uVar12 >> 1) & 0x7fffffff) + (int)uVar12) < range);
      }
    }
  }
  return (wchar_t)uVar13;
}

Assistant:

int project_path(struct chunk *c, struct loc *gp, int range, struct loc grid1,
				 struct loc grid2, int flg)
{
	int y, x;

	int n = 0;
	int k = 0;

	/* Absolute */
	int ay, ax;

	/* Offsets */
	int sy, sx;

	/* Fractions */
	int frac;

	/* Scale factors */
	int full, half;

	/* Slope */
	int m;

	/* Possible decoy */
	struct loc decoy = cave_find_decoy(c);

	/* No path necessary (or allowed) */
	if (loc_eq(grid1, grid2)) return (0);


	/* Analyze "dy" */
	if (grid2.y < grid1.y) {
		ay = (grid1.y - grid2.y);
		sy = -1;
	} else {
		ay = (grid2.y - grid1.y);
		sy = 1;
	}

	/* Analyze "dx" */
	if (grid2.x < grid1.x) {
		ax = (grid1.x - grid2.x);
		sx = -1;
	} else {
		ax = (grid2.x - grid1.x);
		sx = 1;
	}


	/* Number of "units" in one "half" grid */
	half = (ay * ax);

	/* Number of "units" in one "full" grid */
	full = half << 1;


	/* Vertical */
	if (ay > ax) {
		/* Start at tile edge */
		frac = ax * ax;

		/* Let m = ((dx/dy) * full) = (dx * dx * 2) = (frac * 2) */
		m = frac << 1;

		/* Start */
		y = grid1.y + sy;
		x = grid1.x;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (k >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Slant */
			if (m) {
				/* Advance (X) part 1 */
				frac += m;

				/* Horizontal change */
				if (frac >= half) {
					/* Advance (X) part 2 */
					x += sx;

					/* Advance (X) part 3 */
					frac -= full;

					/* Track distance */
					k++;
				}
			}

			/* Advance (Y) */
			y += sy;
		}
	}

	/* Horizontal */
	else if (ax > ay) {
		/* Start at tile edge */
		frac = ay * ay;

		/* Let m = ((dy/dx) * full) = (dy * dy * 2) = (frac * 2) */
		m = frac << 1;

		/* Start */
		y = grid1.y;
		x = grid1.x + sx;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (k >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Slant */
			if (m) {
				/* Advance (Y) part 1 */
				frac += m;

				/* Vertical change */
				if (frac >= half) {
					/* Advance (Y) part 2 */
					y += sy;

					/* Advance (Y) part 3 */
					frac -= full;

					/* Track distance */
					k++;
				}
			}

			/* Advance (X) */
			x += sx;
		}
	}

	/* Diagonal */
	else {
		/* Start */
		y = grid1.y + sy;
		x = grid1.x + sx;

		/* Create the projection path */
		while (1) {
			/* Save grid */
			gp[n++] = loc(x, y);

			/* Hack -- Check maximum range */
			if ((n + (n >> 1)) >= range) break;

			/* Sometimes stop at finish grid */
			if (!(flg & (PROJECT_THRU)))
				if (loc_eq(loc(x, y), grid2)) break;

			/* Don't stop if making paths through rock for generation */
			if (!(flg & (PROJECT_ROCK))) {
				/* Stop at non-initial wall grids, except where that would
				 * leak info during targetting */
				if (!(flg & (PROJECT_INFO))) {
					if ((n > 0) && !square_isprojectable(c, loc(x, y))) {
						break;
					}
				} else if ((n > 0) && square_isbelievedwall(c, loc(x, y))) {
					break;
				}
			}

			/* Sometimes stop at non-initial monsters/players, decoys */
			if (flg & (PROJECT_STOP)) {
				if ((n > 0) && (square(c, loc(x, y))->mon != 0)) break;
				if (loc_eq(loc(x, y), decoy)) break;
			}

			/* Advance */
			y += sy;
			x += sx;
		}
	}

	/* Length */
	return (n);
}